

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O2

void __thiscall upb::generator::Plugin::Plugin(Plugin *this)

{
  Arena::Arena(&this->arena_);
  DefPool::DefPool(&this->pool_);
  ReadRequest(this);
  return;
}

Assistant:

Plugin() { ReadRequest(); }